

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1018143::Target::DumpLauncher
          (Value *__return_storage_ptr__,Target *this,char *name,char *type)

{
  cmGeneratorTarget *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  __shared_count<(__gnu_cxx::_Lock_policy)2> lg_00;
  bool bVar1;
  cmake *cmakeInstance;
  string *psVar2;
  pointer this_01;
  ulong uVar3;
  reference pvVar4;
  Value *pVVar5;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar6;
  string *local_2f8;
  Value local_280;
  reference local_258;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin3;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_230;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_220;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range3;
  Value args;
  string local_1c8;
  Value local_1a8;
  Value local_180;
  undefined1 local_158 [8];
  string command;
  string local_130;
  string local_110 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [40];
  undefined8 local_b8;
  undefined1 local_b0 [8];
  cmList commandWithArgs;
  undefined1 local_88 [8];
  cmGeneratorExpression ge;
  cmLocalGenerator *lg;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue property;
  char *type_local;
  char *name_local;
  Target *this_local;
  Value *launcher;
  
  this_00 = this->GT;
  property.Value = (string *)type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  local_30 = cmGeneratorTarget::GetProperty(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  Json::Value::Value(__return_storage_ptr__,nullValue);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         cmGeneratorTarget::GetLocalGenerator(this->GT);
    cmakeInstance =
         cmLocalGenerator::GetCMakeInstance
                   ((cmLocalGenerator *)
                    ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                    .
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    commandWithArgs.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)
               &commandWithArgs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_88,cmakeInstance,
               (cmListFileBacktrace *)
               &commandWithArgs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &commandWithArgs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    command.field_2._M_local_buf[0xf] = '\x01';
    local_f0._8_8_ = local_e0;
    psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::string(local_110,(string *)psVar2);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_f0,(string *)local_88);
    this_01 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)local_f0);
    lg_00 = ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
    psVar2 = this->Config;
    std::__cxx11::string::string((string *)&local_130);
    psVar2 = cmCompiledGeneratorExpression::Evaluate
                       (this_01,(cmLocalGenerator *)lg_00._M_pi,psVar2,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_130);
    std::__cxx11::string::string((string *)local_e0,(string *)psVar2);
    command.field_2._M_local_buf[0xf] = '\0';
    local_e0._32_8_ = local_e0;
    local_b8 = 1;
    init._M_len = 1;
    init._M_array = (iterator)local_e0._32_8_;
    cmList::cmList((cmList *)local_b0,init);
    local_2f8 = (string *)(local_e0 + 0x20);
    do {
      local_2f8 = local_2f8 + -0x20;
      std::__cxx11::string::~string(local_2f8);
    } while (local_2f8 != (string *)local_e0);
    std::__cxx11::string::~string((string *)&local_130);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_f0);
    std::__cxx11::string::~string(local_110);
    bVar1 = cmList::empty((cmList *)local_b0);
    if (!bVar1) {
      cmList::operator[][abi_cxx11_((cmList *)local_b0,0);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        pvVar4 = cmList::operator[][abi_cxx11_((cmList *)local_b0,0);
        std::__cxx11::string::string((string *)local_158,(string *)pvVar4);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_158);
        Json::Value::Value(&local_180,objectValue);
        Json::Value::operator=(__return_storage_ptr__,&local_180);
        Json::Value::~Value(&local_180);
        RelativeIfUnder(&local_1c8,&this->TopSource,(string *)local_158);
        Json::Value::Value(&local_1a8,&local_1c8);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,"command");
        Json::Value::operator=(pVVar5,&local_1a8);
        Json::Value::~Value(&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        Json::Value::Value((Value *)&args.limit_,(char *)property.Value);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,"type");
        Json::Value::operator=(pVVar5,(Value *)&args.limit_);
        Json::Value::~Value((Value *)&args.limit_);
        Json::Value::Value((Value *)&__range3,nullValue);
        cVar6 = cmMakeRange<cmList>((cmList *)local_b0);
        __begin3 = cVar6.Begin._M_current;
        local_230 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&__begin3,1);
        local_220 = &local_230;
        __end3 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::begin(local_220);
        arg = (string *)
              cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::end(local_220);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&arg);
          if (!bVar1) break;
          local_258 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          Json::Value::Value(&local_280,local_258);
          Json::Value::append((Value *)&__range3,&local_280);
          Json::Value::~Value(&local_280);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        bVar1 = Json::Value::empty((Value *)&__range3);
        if (!bVar1) {
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,"arguments");
          Json::Value::operator=(pVVar5,(Value *)&__range3);
        }
        Json::Value::~Value((Value *)&__range3);
        std::__cxx11::string::~string((string *)local_158);
      }
    }
    cmList::~cmList((cmList *)local_b0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLauncher(const char* name, const char* type)
{
  cmValue property = this->GT->GetProperty(name);
  Json::Value launcher;
  if (property) {
    cmLocalGenerator* lg = this->GT->GetLocalGenerator();
    cmGeneratorExpression ge(*lg->GetCMakeInstance());
    cmList commandWithArgs{ ge.Parse(*property)->Evaluate(lg, this->Config) };
    if (!commandWithArgs.empty() && !commandWithArgs[0].empty()) {
      std::string command(commandWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(command);
      launcher = Json::objectValue;
      launcher["command"] = RelativeIfUnder(this->TopSource, command);
      launcher["type"] = type;
      Json::Value args;
      for (std::string const& arg : cmMakeRange(commandWithArgs).advance(1)) {
        args.append(arg);
      }
      if (!args.empty()) {
        launcher["arguments"] = std::move(args);
      }
    }
  }
  return launcher;
}